

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeShape.cpp
# Opt level: O0

void __thiscall OpenMD::CompositeShape::~CompositeShape(CompositeShape *this)

{
  CompositeShape *in_RDI;
  
  ~CompositeShape(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

CompositeShape::~CompositeShape() { Utils::deletePointers(shapes_); }